

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

DecodeRawTransactionRequestStruct * __thiscall
cfd::api::json::DecodeRawTransactionRequest::ConvertToStruct(DecodeRawTransactionRequest *this)

{
  DecodeRawTransactionRequestStruct *in_RSI;
  DecodeRawTransactionRequestStruct *in_RDI;
  DecodeRawTransactionRequestStruct *result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  DecodeRawTransactionRequestStruct *this_00;
  
  this_00 = in_RDI;
  DecodeRawTransactionRequestStruct::DecodeRawTransactionRequestStruct(in_RSI);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&in_RSI->field_0x38);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->network,
             (string *)
             &(in_RSI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  in_RDI->iswitness = (bool)((byte)in_RSI[1].hex & 1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,in_stack_ffffffffffffffb8);
  return this_00;
}

Assistant:

DecodeRawTransactionRequestStruct DecodeRawTransactionRequest::ConvertToStruct() const {  // NOLINT
  DecodeRawTransactionRequestStruct result;
  result.hex = hex_;
  result.network = network_;
  result.iswitness = iswitness_;
  result.ignore_items = ignore_items;
  return result;
}